

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkits_testcases-inl.h
# Opt level: O0

void __thiscall
bssl::gtest_suite_PkitsTest04BasicCertificateRevocationTests_::
Section4MissingCRLTest1<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>::TestBody
          (Section4MissingCRLTest1<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate> *this)

{
  undefined1 local_b0 [8];
  PkitsTestInfo info;
  char *crls [1];
  char *certs [3];
  Section4MissingCRLTest1<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate> *this_local;
  
  crls[0] = "TrustAnchorRootCertificate";
  info.user_constrained_policy_set._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (size_t)anon_var_dwarf_19793f;
  PkitsTestInfo::PkitsTestInfo((PkitsTestInfo *)local_b0);
  local_b0 = (undefined1  [8])0x6f3d12;
  info.time.year._0_1_ = 0;
  PkitsTest<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>::RunTest<3ul,1ul>
            ((PkitsTest<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate> *)this,
             (char *(*) [3])crls,
             (char *(*) [1])
             &info.user_constrained_policy_set._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (PkitsTestInfo *)local_b0);
  PkitsTestInfo::~PkitsTestInfo((PkitsTestInfo *)local_b0);
  return;
}

Assistant:

WRAPPED_TYPED_TEST_P(PkitsTest04BasicCertificateRevocationTests,
                     Section4MissingCRLTest1) {
  const char* const certs[] = {"TrustAnchorRootCertificate", "NoCRLCACert",
                               "InvalidMissingCRLTest1EE"};
  const char* const crls[] = {"TrustAnchorRootCRL"};
  PkitsTestInfo info;
  info.test_number = "4.4.1";
  info.should_validate = false;

  this->RunTest(certs, crls, info);
}